

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_symphony.c
# Opt level: O0

int32_t ll_cloud_gpio_get_pin_status(uint8_t pin,_Bool *active)

{
  _Bool _Var1;
  int32_t local_20;
  int32_t ret;
  _Bool *active_local;
  uint8_t pin_local;
  
  _Var1 = transport_mutex_grab();
  if (_Var1) {
    _ll_ifc_message_buff[0] = pin;
    local_20 = hal_read_write(OP_GPIO_PIN_STATUS,_ll_ifc_message_buff,1,(uint8_t *)0x0,0);
    transport_mutex_release();
    if (-1 < local_20) {
      local_20 = 0;
    }
    active_local._4_4_ = local_20;
  }
  else {
    active_local._4_4_ = -0x71;
  }
  return active_local._4_4_;
}

Assistant:

int32_t ll_cloud_gpio_get_pin_status(uint8_t pin, bool *active)
{
    if (!(transport_mutex_grab()))
    {
        return LL_IFC_ERROR_HAL_CALL_FAILED;
    }
    _ll_ifc_message_buff[0] = pin;
    int32_t ret = hal_read_write(OP_GPIO_PIN_STATUS, &_ll_ifc_message_buff[0], 1, NULL, 0);

    transport_mutex_release();

    return (ret >= 0) ? LL_IFC_ACK : ret;
}